

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Data<QHashPrivate::Node<QGraphicsLayoutItem_*,_QHashDummyValue>_> *
QHashPrivate::Data<QHashPrivate::Node<QGraphicsLayoutItem_*,_QHashDummyValue>_>::detached
          (Data<QHashPrivate::Node<QGraphicsLayoutItem_*,_QHashDummyValue>_> *d)

{
  Data<QHashPrivate::Node<QGraphicsLayoutItem_*,_QHashDummyValue>_> *this;
  
  this = (Data<QHashPrivate::Node<QGraphicsLayoutItem_*,_QHashDummyValue>_> *)operator_new(0x28);
  if (d == (Data<QHashPrivate::Node<QGraphicsLayoutItem_*,_QHashDummyValue>_> *)0x0) {
    Data(this,0);
  }
  else {
    Data(this,d);
    if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (d->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (d->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((d->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        ~Data(d);
        operator_delete(d,0x28);
      }
    }
  }
  return this;
}

Assistant:

static Data *detached(Data *d)
    {
        if (!d)
            return new Data;
        Data *dd = new Data(*d);
        if (!d->ref.deref())
            delete d;
        return dd;
    }